

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

void __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::GetListValues
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *this,idx_t row_idx,TYPE *start_value,
          TYPE *end_value,INCREMENT_TYPE *increment_value)

{
  sel_t *psVar1;
  TYPE TVar2;
  idx_t iVar3;
  bool bVar4;
  INCREMENT_TYPE IVar5;
  
  TVar2 = StartListValue(this,row_idx);
  start_value->value = (int64_t)TVar2;
  bVar4 = (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start != 0x68;
  psVar1 = (this->vdata[bVar4].sel)->sel_vector;
  iVar3 = row_idx;
  if (psVar1 != (sel_t *)0x0) {
    iVar3 = (idx_t)psVar1[row_idx];
  }
  end_value->value = *(int64_t *)(this->vdata[bVar4].data + iVar3 * 8);
  IVar5 = ListIncrementValue(this,row_idx);
  *increment_value = IVar5;
  return;
}

Assistant:

void GetListValues(idx_t row_idx, typename OP::TYPE &start_value, typename OP::TYPE &end_value,
	                   typename OP::INCREMENT_TYPE &increment_value) {
		start_value = StartListValue(row_idx);
		end_value = EndListValue(row_idx);
		increment_value = ListIncrementValue(row_idx);
	}